

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O2

int testMissingEpsParameter(void)

{
  bool bVar1;
  ostream *poVar2;
  ostream *this;
  NeuralNetwork *pNVar3;
  int iVar4;
  char *pcVar5;
  Model m;
  undefined1 local_b8 [40];
  Result res;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_68;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_38;
  
  CoreML::Specification::Model::Model(&m);
  buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(&m);
  CoreML::Model::validate(&res,&m);
  bVar1 = CoreML::Result::good(&res);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    this = (ostream *)std::operator<<(poVar2,":");
    iVar4 = 0x3df;
LAB_001680e1:
    poVar2 = (ostream *)std::ostream::operator<<(this,iVar4);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar5 = "!((res).good())";
  }
  else {
    pNVar3 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
    addLearningRate<CoreML::Specification::NeuralNetwork>
              (pNVar3,kAdamOptimizer,0.699999988079071,0.0,1.0);
    pNVar3 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
    local_38._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_38._M_impl.super__Rb_tree_header._M_header;
    local_38._M_impl._0_8_ = 0;
    local_38._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_38._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_38._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_38._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_38._M_impl.super__Rb_tree_header._M_header._M_right =
         local_38._M_impl.super__Rb_tree_header._M_header._M_left;
    addMiniBatchSize<CoreML::Specification::NeuralNetwork>
              (pNVar3,kAdamOptimizer,10,5,100,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&local_38);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_38);
    pNVar3 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl._0_8_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    addEpochs<CoreML::Specification::NeuralNetwork>
              (pNVar3,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_68);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_68);
    pNVar3 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
    addBeta1(pNVar3,kAdamOptimizer,0.699999988079071,0.0,1.0);
    pNVar3 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
    addBeta2(pNVar3,kAdamOptimizer,0.699999988079071,0.0,1.0);
    CoreML::Model::validate((Result *)local_b8,&m);
    CoreML::Result::operator=(&res,(Result *)local_b8);
    std::__cxx11::string::~string((string *)(local_b8 + 8));
    bVar1 = CoreML::Result::good(&res);
    if (bVar1) {
      poVar2 = std::operator<<((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                              );
      this = (ostream *)std::operator<<(poVar2,":");
      iVar4 = 0x3e9;
      goto LAB_001680e1;
    }
    pNVar3 = CoreML::Specification::Model::_internal_mutable_neuralnetwork(&m);
    addEps(pNVar3,kAdamOptimizer,0.699999988079071,0.0,1.0);
    CoreML::Model::validate((Result *)local_b8,&m);
    CoreML::Result::operator=(&res,(Result *)local_b8);
    std::__cxx11::string::~string((string *)(local_b8 + 8));
    bVar1 = CoreML::Result::good(&res);
    iVar4 = 0;
    if (bVar1) goto LAB_00168121;
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
                            );
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0x3ef);
    poVar2 = std::operator<<(poVar2,": error: ");
    pcVar5 = "(res).good()";
  }
  poVar2 = std::operator<<(poVar2,pcVar5);
  poVar2 = std::operator<<(poVar2," was false, expected true.");
  std::endl<char,std::char_traits<char>>(poVar2);
  iVar4 = 1;
LAB_00168121:
  std::__cxx11::string::~string((string *)&res.m_message);
  CoreML::Specification::Model::~Model(&m);
  return iVar4;
}

Assistant:

int testMissingEpsParameter() {

    Specification::Model m;

    // basic neural network model without any updatable model parameters.
    buildBasicUpdatableModelWithCategoricalCrossEntropyAndSoftmax(m);

    // expect validation to fail due to missing updatable model parameters.
    Result res = Model::validate(m);
    ML_ASSERT_BAD(res);

    // now add an updatable model parameter.
    addLearningRate(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);
    addMiniBatchSize(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 10, 5, 100, std::set<int64_t>());
    addEpochs(m.mutable_neuralnetwork(), 100, 1, 100, std::set<int64_t>());
    addBeta1(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);
    addBeta2(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);

    res = Model::validate(m);
    ML_ASSERT_BAD(res);

    addEps(m.mutable_neuralnetwork(), Specification::Optimizer::kAdamOptimizer, 0.7f, 0.0f, 1.0f);

    // expect validation to pass.
    res = Model::validate(m);
    ML_ASSERT_GOOD(res);
    return 0;
}